

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Nullability __thiscall
wasm::TranslateToFuzzReader::getSuperType(TranslateToFuzzReader *this,Nullability nullability)

{
  Nullability nullability_local;
  TranslateToFuzzReader *this_local;
  
  if (nullability == Nullable) {
    this_local._4_4_ = Nullable;
  }
  else {
    this_local._4_4_ = getNullability(this);
  }
  return this_local._4_4_;
}

Assistant:

Nullability TranslateToFuzzReader::getSuperType(Nullability nullability) {
  if (nullability == Nullable) {
    return Nullable;
  }
  return getNullability();
}